

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::add(CmdLine *this,Arg *a)

{
  long *plVar1;
  bool bVar2;
  undefined8 uVar3;
  ulong uVar4;
  long *in_RSI;
  long in_RDI;
  string *in_stack_00000020;
  string *in_stack_00000028;
  SpecificationException *in_stack_00000030;
  ArgListIterator it;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff67;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined1 local_78 [88];
  _Self local_20;
  _Self local_18;
  long *local_10;
  
  local_10 = in_RSI;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                 (in_stack_ffffffffffffff28);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                   (in_stack_ffffffffffffff28);
    bVar2 = std::operator!=(&local_18,&local_20);
    plVar1 = local_10;
    if (!bVar2) {
      (**(code **)(*local_10 + 0x10))(local_10,in_RDI + 8);
      uVar4 = (**(code **)(*local_10 + 0x28))();
      if ((uVar4 & 1) != 0) {
        *(int *)(in_RDI + 0x80) = *(int *)(in_RDI + 0x80) + 1;
      }
      return;
    }
    std::_List_iterator<TCLAP::Arg_*>::operator*((_List_iterator<TCLAP::Arg_*> *)0x14de23);
    uVar4 = (**(code **)(*plVar1 + 0x20))();
    if ((uVar4 & 1) != 0) break;
    std::_List_iterator<TCLAP::Arg_*>::operator++(&local_18,0);
  }
  uVar5 = 1;
  uVar3 = __cxa_allocate_exception(0x68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff67,CONCAT16(uVar5,in_stack_ffffffffffffff60)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff67,CONCAT16(uVar5,in_stack_ffffffffffffff60)));
  (**(code **)(*local_10 + 0x48))(local_78,local_10,&stack0xffffffffffffff68);
  SpecificationException::SpecificationException
            (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  __cxa_throw(uVar3,&SpecificationException::typeinfo,
              SpecificationException::~SpecificationException);
}

Assistant:

inline void CmdLine::add( Arg* a )
{
	for( ArgListIterator it = _argList.begin(); it != _argList.end(); it++ )
		if ( *a == *(*it) )
			throw( SpecificationException(
			        "Argument with same flag/name already exists!",
			        a->longID() ) );

	a->addToList( _argList );

	if ( a->isRequired() )
		_numRequired++;
}